

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ArrayStrideValidator::validateSingleVariable
          (ArrayStrideValidator *this,
          vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
          *path,string *resource,GLint propValue,string *implementationName)

{
  ostringstream *poVar1;
  pointer pVVar2;
  pointer pVVar3;
  GLint GVar4;
  int iVar5;
  DataType DVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  allocator<char> local_1b5;
  GLint local_1b4;
  MessageBuilder local_1b0;
  
  pVVar2 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (path->
           super__Vector_base<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar8 = (long)pVVar3 - (long)pVVar2;
  if (pVVar2->m_type == TYPE_INTERFACEBLOCK) {
    bVar9 = ((pVVar2->m_data).block)->storage - STORAGE_UNIFORM < 2;
  }
  else {
    bVar9 = false;
  }
  bVar10 = true;
  if ((0x10 < uVar8) && (*(int *)((long)pVVar2 + (uVar8 - 0x18)) == 0)) {
    bVar10 = **(int **)((long)pVVar2 + (uVar8 - 0x20)) != 1;
  }
  DVar6 = ((pVVar3[-1].m_data.block)->layout).offset;
  if ((bVar10) || (bVar9 != true)) {
    iVar7 = (byte)(bVar9 | DVar6 == TYPE_UINT_ATOMIC_COUNTER) - 1;
    iVar5 = 4;
    if (DVar6 != TYPE_UINT_ATOMIC_COUNTER) {
      iVar5 = iVar7;
    }
    if (bVar10) {
      iVar5 = iVar7;
    }
    local_1b0.m_log = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Verifying array stride, expecting ");
    std::ostream::operator<<(poVar1,iVar5);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    if (iVar5 == propValue) {
      return;
    }
    local_1b0.m_log = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"\tError, got ");
    std::ostream::operator<<(poVar1,propValue);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"resource array stride invalid",&local_1b5);
    PropValidator::setError((PropValidator *)this,(string *)&local_1b0);
  }
  else {
    local_1b4 = propValue;
    iVar5 = glu::getDataTypeScalarSize(DVar6);
    DVar6 = glu::getDataTypeScalarType(((pVVar3[-1].m_data.block)->layout).offset);
    local_1b0.m_log = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Verifying array stride, expecting greater or equal to ");
    iVar5 = (uint)((DVar6 == TYPE_BOOL || DVar6 == TYPE_FLOAT) ||
                  (DVar6 & ~TYPE_FLOAT_VEC4) == TYPE_INT) * iVar5 * 4;
    std::ostream::operator<<(poVar1,iVar5);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    GVar4 = local_1b4;
    if (iVar5 <= local_1b4) {
      return;
    }
    local_1b0.m_log = ((this->super_SingleVariableValidator).super_PropValidator.m_testCtx)->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"\tError, got ");
    std::ostream::operator<<(poVar1,GVar4);
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,"resource array stride invalid",&local_1b5);
    PropValidator::setError((PropValidator *)this,(string *)&local_1b0);
  }
  std::__cxx11::string::~string((string *)&local_1b0);
  return;
}

Assistant:

void ArrayStrideValidator::validateSingleVariable (const std::vector<VariablePathComponent>& path, const std::string& resource, glw::GLint propValue, const std::string& implementationName) const
{
	const VariablePathComponent		nullComponent;
	const VariablePathComponent&	component			= path.back();
	const VariablePathComponent&	enclosingcomponent	= (path.size() > 1) ? (path[path.size()-2]) : (nullComponent);
	const VariablePathComponent&	firstComponent		= path.front();

	const bool						isBufferBlock		= firstComponent.isInterfaceBlock() && isBufferBackedInterfaceBlockStorage(firstComponent.getInterfaceBlock()->storage);
	const bool						isArray				= enclosingcomponent.isVariableType() && enclosingcomponent.getVariableType()->isArrayType();
	const bool						isAtomicCounter		= glu::isDataTypeAtomicCounter(component.getVariableType()->getBasicType()); // atomic counters are buffer backed with a stride of 4 basic machine units

	DE_UNREF(resource);
	DE_UNREF(implementationName);

	// Layout tests will verify layouts of buffer backed arrays properly. Here we just check values are greater or equal to the element size
	if (isBufferBlock && isArray)
	{
		const int elementSize = glu::getDataTypeScalarSize(component.getVariableType()->getBasicType()) * getTypeSize(glu::getDataTypeScalarType(component.getVariableType()->getBasicType()));
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying array stride, expecting greater or equal to " << elementSize << tcu::TestLog::EndMessage;

		if (propValue < elementSize)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource array stride invalid");
		}
	}
	else
	{
		// Atomics are buffer backed with stride of 4 even though they are not in an interface block
		const int arrayStride = (isAtomicCounter && isArray) ? (4) : (!isBufferBlock && !isAtomicCounter) ? (-1) : (0);

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying array stride, expecting " << arrayStride << tcu::TestLog::EndMessage;

		if (arrayStride != propValue)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "\tError, got " << propValue << tcu::TestLog::EndMessage;
			setError("resource array stride invalid");
		}
	}
}